

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O0

UBool __thiscall
icu_63::FieldPositionIterator::operator==(FieldPositionIterator *this,FieldPositionIterator *rhs)

{
  FieldPositionIterator *rhs_local;
  FieldPositionIterator *this_local;
  
  if (rhs == this) {
    this_local._7_1_ = '\x01';
  }
  else if (this->pos == rhs->pos) {
    if (this->data == (UVector32 *)0x0) {
      this_local._7_1_ = rhs->data == (UVector32 *)0x0;
    }
    else if (rhs->data == (UVector32 *)0x0) {
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = UVector32::operator==(this->data,rhs->data);
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool FieldPositionIterator::operator==(const FieldPositionIterator &rhs) const {
  if (&rhs == this) {
    return TRUE;
  }
  if (pos != rhs.pos) {
    return FALSE;
  }
  if (!data) {
    return rhs.data == NULL;
  }
  return rhs.data ? data->operator==(*rhs.data) : FALSE;
}